

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void av1_prune_partitions_before_search
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PartitionSearchState *part_state)

{
  int iVar1;
  aom_bit_depth_t bit_depth;
  NN_CONFIG *pNVar2;
  _Bool _Var3;
  int16_t iVar4;
  int f_idx;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  int *piVar16;
  long lVar17;
  BLOCK_SIZE BVar18;
  long lVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  byte bVar23;
  float fVar24;
  ulong in_stack_fffffffffffffd28;
  undefined8 uVar25;
  uint8_t *image [1];
  CNN_MULTI_OUT output;
  int out_chs [4];
  int output_dims [4];
  CNN_THREAD_DATA thread_data;
  float dnn_features [100];
  
  bVar23 = 0;
  BVar18 = (part_state->part_blk_params).bsize;
  if ((cpi->sf).part_sf.rect_partition_eval_thresh < (int)(uint)BVar18) {
    part_state->do_rectangular_split = 0;
    part_state->partition_rect_allowed[0] = 0;
    part_state->partition_rect_allowed[1] = 0;
  }
  iVar1 = (cpi->sf).part_sf.prune_rectangular_split_based_on_qidx;
  uVar20 = (uint)BVar18;
  if (iVar1 == 2) {
    iVar1 = x->qindex * 3;
    iVar5 = x->qindex * 3 + 0xff;
    if (-1 < iVar1) {
      iVar5 = iVar1;
    }
    uVar6 = (iVar5 >> 8) * -3;
    uVar10 = 0xfffffff7;
    if (-9 < (int)uVar6) {
      uVar10 = uVar6;
    }
    if (uVar20 < ((int)uVar10 >> 0x1f & uVar10) + 9) {
LAB_0031ce17:
      part_state->do_rectangular_split = 0;
      part_state->partition_rect_allowed[0] = 0;
      part_state->partition_rect_allowed[1] = 0;
    }
LAB_0031ce2c:
    iVar1 = (cpi->sf).part_sf.prune_sub_8x8_partition_level;
    if ((BVar18 == BLOCK_8X8 && iVar1 != 0) &&
       ((iVar1 == 2 ||
        ((((x->e_mbd).left_available == true && ((x->e_mbd).up_available == true)) &&
         ((BLOCK_8X8 < ((x->e_mbd).left_mbmi)->bsize || (BLOCK_8X8 < ((x->e_mbd).above_mbmi)->bsize)
          ))))))) {
      part_state->partition_rect_allowed[0] = 0;
      part_state->partition_rect_allowed[1] = 0;
      part_state->do_rectangular_split = 0;
      part_state->do_square_split = 0;
    }
  }
  else {
    if (iVar1 != 1) goto LAB_0031ce2c;
    if (BVar18 == BLOCK_8X8) {
      if (x->qindex < 0x23) goto LAB_0031ce17;
      goto LAB_0031ce2c;
    }
  }
  if (((((((cpi->common).current_frame.frame_type & 0xfd) == 0) &&
        (iVar1 = (cpi->sf).part_sf.intra_cnn_based_part_prune_level, iVar1 != 0)) &&
       (BVar18 < BLOCK_64X128)) &&
      ((BLOCK_64X32 < ((cpi->common).seq_params)->sb_size &&
       ((part_state->part_blk_params).bsize_at_least_8x8 != 0)))) &&
     (((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar20] + (part_state->part_blk_params).mi_row) <=
       (cpi->common).mi_params.mi_rows &&
      ((int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar20] + (part_state->part_blk_params).mi_col) <=
       (cpi->common).mi_params.mi_cols)))) {
    iVar5 = (x->part_search_info).quad_tree_idx;
    lVar8 = (long)iVar5;
    switch(BVar18) {
    case BLOCK_8X8:
      uVar11 = 4;
      break;
    default:
      uVar11 = 0xffffffffffffffff;
      break;
    case BLOCK_16X16:
      uVar11 = 3;
      break;
    case BLOCK_32X32:
      uVar11 = 2;
      break;
    case BLOCK_64X64:
      uVar11 = 1;
      bVar21 = true;
      if ((x->part_search_info).cnn_output_valid == 0) {
        thread_data.num_workers = 1;
        thread_data._4_4_ = 0;
        thread_data.workers = (AVxWorker *)0x0;
        output_dims[0] = 1;
        output_dims[1] = 2;
        output_dims[2] = 4;
        output_dims[3] = 8;
        out_chs[0] = 0x14;
        out_chs[1] = 4;
        out_chs[2] = 0x14;
        out_chs[3] = 0x14;
        pfVar14 = (x->part_search_info).cnn_buffer;
        pfVar12 = dnn_features;
        lVar17 = 0;
        do {
          lVar13 = (long)out_chs[lVar17];
          if (0 < lVar13) {
            iVar7 = output_dims[lVar17];
            lVar15 = 0;
            do {
              *(float **)(pfVar12 + lVar15 * 2) = pfVar14;
              lVar15 = lVar15 + 1;
              pfVar14 = pfVar14 + (uint)(iVar7 * iVar7);
            } while (lVar13 != lVar15);
          }
          pfVar12 = pfVar12 + lVar13 * 2;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        output.num_outputs = 4;
        output.output_channels = out_chs;
        output.output_strides = output_dims;
        output.output_buffer = (float **)dnn_features;
        bit_depth = (x->e_mbd).bd;
        in_stack_fffffffffffffd28 = (ulong)bit_depth;
        iVar4 = av1_dc_quant_QTX(x->qindex,0,bit_depth);
        iVar7 = (int)iVar4 >> ((char)in_stack_fffffffffffffd28 - 8U & 0x1f);
        fVar24 = log1pf((float)(iVar7 * iVar7) * 0.00390625);
        (x->part_search_info).log_q = (fVar24 + -1.191922) / 1.730044;
        iVar7 = x->plane[0].src.stride;
        if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
          image[0] = x->plane[0].src.buf + ~(long)iVar7;
          _Var3 = av1_cnn_predict_img_multi_out
                            (image,0x41,0x41,iVar7,&av1_intra_mode_cnn_partition_cnn_config,
                             &thread_data,&output);
        }
        else {
          image[0] = (uint8_t *)((long)x->plane[0].src.buf * 2 + (long)iVar7 * -2 + -2);
          _Var3 = av1_cnn_predict_img_multi_out_highbd
                            ((uint16_t **)image,0x41,0x41,iVar7,
                             &av1_intra_mode_cnn_partition_cnn_config,&thread_data,
                             (int)in_stack_fffffffffffffd28,&output);
        }
        if (_Var3 == false) {
          aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,"Error allocating CNN data");
          goto LAB_0031ce92;
        }
        (x->part_search_info).cnn_output_valid = 1;
        uVar11 = 1;
        bVar21 = true;
      }
      goto LAB_0031d349;
    }
    bVar21 = false;
LAB_0031d349:
    if ((x->part_search_info).cnn_output_valid != 0) {
      pNVar2 = *(NN_CONFIG **)(&DAT_005e99c0 + uVar11 * 8);
      output.num_outputs = 0;
      output._4_4_ = 0;
      output.output_channels = (int *)0x0;
      pfVar12 = (x->part_search_info).cnn_buffer;
      pfVar14 = (x->part_search_info).cnn_buffer + 0x14;
      if (bVar21) {
        lVar17 = 0x14;
        pfVar9 = dnn_features;
        for (lVar8 = 0x14; lVar8 != 0; lVar8 = lVar8 + -1) {
          *pfVar9 = *pfVar12;
          pfVar12 = pfVar12 + (ulong)bVar23 * -2 + 1;
          pfVar9 = pfVar9 + (ulong)bVar23 * -2 + 1;
        }
        lVar8 = 0;
        do {
          lVar15 = lVar17 << 0x20;
          lVar17 = (long)(int)lVar17;
          lVar13 = lVar17 * 4;
          lVar19 = 0;
          do {
            lVar15 = lVar15 + 0x100000000;
            lVar17 = lVar17 + 1;
            *(float *)((long)dnn_features + lVar19 + lVar13) = pfVar14[lVar19];
            lVar19 = lVar19 + 4;
          } while (lVar19 != 0x10);
          lVar8 = lVar8 + 1;
          pfVar14 = pfVar14 + 1;
        } while (lVar8 != 4);
        *(float *)((long)dnn_features + (lVar15 >> 0x1e)) = (x->part_search_info).log_q;
      }
      else if (uVar20 == 3) {
        iVar7 = iVar5 + 2;
        if (-1 < iVar5 + -1) {
          iVar7 = iVar5 + -1;
        }
        pfVar12 = (x->part_search_info).cnn_buffer +
                  (long)(int)av1_partition_breakout_nn_bias_128_layer0[(long)(iVar7 >> 2) + 0x1f] +
                  0x24;
        lVar17 = 0;
        do {
          dnn_features[lVar17] = *pfVar12;
          lVar17 = lVar17 + 1;
          pfVar12 = pfVar12 + 0x10;
        } while (lVar17 != 0x14);
        pfVar12 = (x->part_search_info).cnn_buffer +
                  (long)(int)av1_partition_breakout_nn_bias_128_layer0[lVar8 + 0x1f] + 0x164;
        lVar8 = 0;
        do {
          dnn_features[lVar8 + 0x14] = *pfVar12;
          lVar8 = lVar8 + 1;
          pfVar12 = pfVar12 + 0x40;
        } while (lVar8 != 0x14);
        dnn_features[0x28] = (x->part_search_info).log_q;
      }
      else {
        if (BVar18 == BLOCK_16X16) {
          iVar7 = iVar5 + 2;
          if (-1 < iVar5 + -1) {
            iVar7 = iVar5 + -1;
          }
          iVar5 = *(int *)(&DAT_004e851c + (long)(iVar7 >> 2) * 4);
          lVar17 = 0;
          do {
            *(float *)((long)dnn_features + lVar17) = pfVar14[iVar5 + lVar17];
            lVar17 = lVar17 + 4;
          } while (lVar17 != 0x10);
          pfVar12 = (x->part_search_info).cnn_buffer +
                    (long)(int)av1_partition_breakout_nn_bias_128_layer0[lVar8 + 0x1f] + 0x24;
          lVar8 = 4;
          do {
            dnn_features[lVar8] = *pfVar12;
            lVar8 = lVar8 + 1;
            pfVar12 = pfVar12 + 0x10;
          } while (lVar8 != 0x18);
        }
        else {
          if (BVar18 != BLOCK_32X32) goto LAB_0031d6c6;
          pfVar9 = dnn_features;
          for (lVar17 = 0x14; lVar17 != 0; lVar17 = lVar17 + -1) {
            *pfVar9 = *pfVar12;
            pfVar12 = pfVar12 + (ulong)bVar23 * -2 + 1;
            pfVar9 = pfVar9 + (ulong)bVar23 * -2 + 1;
          }
          iVar5 = *(int *)(&DAT_004e851c + lVar8 * 4);
          lVar8 = 0;
          do {
            *(float *)((long)dnn_features + lVar8 + 0x50) = pfVar14[iVar5 + lVar8];
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x10);
        }
        dnn_features[0x18] = (x->part_search_info).log_q;
      }
LAB_0031d6c6:
      (*av1_nn_predict)(dnn_features,pNVar2,1,(float *)&output);
      iVar5 = (cpi->common).width;
      iVar7 = (cpi->common).height;
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      pfVar12 = av1_intra_mode_cnn_partition_split_thresh_lowres;
      if (0x1df < iVar7) {
        pfVar12 = av1_intra_mode_cnn_partition_split_thresh_midres;
      }
      pfVar14 = av1_intra_mode_cnn_partition_no_split_thresh_lowres;
      if (0x1df < iVar7) {
        pfVar14 = av1_intra_mode_cnn_partition_no_split_thresh_midres;
      }
      pfVar9 = av1_intra_mode_cnn_partition_split_thresh_hdres;
      if (iVar7 < 0x2d0) {
        pfVar9 = pfVar12;
      }
      pfVar12 = av1_intra_mode_cnn_partition_no_split_thresh_hdres;
      if (iVar7 < 0x2d0) {
        pfVar12 = pfVar14;
      }
      fVar24 = pfVar12[uVar11];
      if (pfVar9[uVar11] <= (float)output.num_outputs && (float)output.num_outputs != pfVar9[uVar11]
         ) {
        if (iVar1 != 1) {
          part_state->partition_none_allowed = 0;
        }
        part_state->partition_rect_allowed[0] = 0;
        part_state->partition_rect_allowed[1] = 0;
        part_state->do_rectangular_split = 0;
        part_state->do_square_split = 1;
      }
      in_stack_fffffffffffffd28 = uVar11;
      if ((float)output.num_outputs < fVar24) {
        part_state->do_square_split = 0;
      }
    }
  }
LAB_0031ce92:
  if (((((cpi->sf).part_sf.simple_motion_search_split != 0) && (part_state->do_square_split != 0))
      && (((part_state->part_blk_params).bsize_at_least_8x8 != 0 &&
          (((BVar18 = (part_state->part_blk_params).bsize,
            (int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [BVar18] + (part_state->part_blk_params).mi_row) <=
            (cpi->common).mi_params.mi_rows &&
            ((int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [BVar18] + (part_state->part_blk_params).mi_col) <=
             (cpi->common).mi_params.mi_cols)) &&
           (((cpi->common).current_frame.frame_type & 0xfd) != 0)))))) &&
     ((cpi->common).width == (cpi->common).superres_upscaled_width)) {
    simple_motion_search_based_split(cpi,x,sms_tree,part_state);
  }
  bVar21 = true;
  if (part_state->do_square_split == 0) {
    bVar21 = part_state->partition_none_allowed != 0;
  }
  if (part_state->do_rectangular_split == 0) {
LAB_0031cf54:
    bVar22 = false;
  }
  else if ((part_state->partition_rect_allowed[0] == 0) || (part_state->prune_rect_part[0] != 0)) {
    if (part_state->partition_rect_allowed[1] == 0) goto LAB_0031cf54;
    bVar22 = part_state->prune_rect_part[1] == 0;
  }
  else {
    bVar22 = true;
  }
  if ((cpi->sf).part_sf.simple_motion_search_prune_rect == 0) {
    return;
  }
  if (!(bool)(bVar21 & bVar22 & ((cpi->common).current_frame.frame_type & 0xfd) != 0)) {
    return;
  }
  iVar1 = (cpi->common).width;
  if (iVar1 != (cpi->common).superres_upscaled_width) {
    return;
  }
  BVar18 = (part_state->part_blk_params).bsize;
  switch(BVar18) {
  case BLOCK_16X16:
    lVar8 = 3;
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
switchD_0031d051_caseD_7:
    lVar8 = -1;
    break;
  case BLOCK_32X32:
    lVar8 = 2;
    break;
  case BLOCK_64X64:
    lVar8 = 1;
    break;
  case BLOCK_128X128:
    lVar8 = 0;
    break;
  default:
    if (BVar18 != BLOCK_8X8) goto switchD_0031d051_caseD_7;
    lVar8 = 4;
  }
  iVar5 = (cpi->common).height;
  if (iVar1 < iVar5) {
    iVar5 = iVar1;
  }
  iVar1 = (cpi->sf).part_sf.simple_motion_search_prune_agg;
  if ((long)iVar1 == -1) {
    return;
  }
  piVar16 = &DAT_004f6a40 + (x->qindex < 0x5b);
  if (iVar1 < 4) {
    piVar16 = quad_to_linear_1 + iVar1;
  }
  if ((long)*piVar16 < 0) {
    return;
  }
  fVar24 = av1_simple_motion_search_prune_rect_thresh[*piVar16]
           [(ulong)(0x1df < iVar5) + (ulong)(0x2cf < iVar5)][lVar8];
  if ((fVar24 == 0.0) && (!NAN(fVar24))) {
    return;
  }
  iVar1 = (&av1_simple_motion_search_prune_rect_nn_config_rel)[lVar8];
  iVar5 = (&av1_simple_motion_search_prune_rect_mean_rel)[lVar8];
  iVar7 = (&av1_simple_motion_search_prune_rect_std_rel)[lVar8];
  dnn_features[0x14] = 0.0;
  dnn_features[0x15] = 0.0;
  dnn_features[0x16] = 0.0;
  dnn_features[0x17] = 0.0;
  dnn_features[0x10] = 0.0;
  dnn_features[0x11] = 0.0;
  dnn_features[0x12] = 0.0;
  dnn_features[0x13] = 0.0;
  dnn_features[0xc] = 0.0;
  dnn_features[0xd] = 0.0;
  dnn_features[0xe] = 0.0;
  dnn_features[0xf] = 0.0;
  dnn_features[8] = 0.0;
  dnn_features[9] = 0.0;
  dnn_features[10] = 0.0;
  dnn_features[0xb] = 0.0;
  dnn_features[4] = 0.0;
  dnn_features[5] = 0.0;
  dnn_features[6] = 0.0;
  dnn_features[7] = 0.0;
  dnn_features[0] = 0.0;
  dnn_features[1] = 0.0;
  dnn_features[2] = 0.0;
  dnn_features[3] = 0.0;
  dnn_features[0x18] = 0.0;
  uVar25 = CONCAT71((int7)(in_stack_fffffffffffffd28 >> 8),BVar18);
  simple_motion_search_prune_part_features
            (cpi,x,sms_tree,(part_state->part_blk_params).mi_row,
             (part_state->part_blk_params).mi_col,BVar18,dnn_features,7);
  bVar23 = (byte)uVar25;
  if (((cpi->sf).part_sf.simple_motion_search_prune_rect != 0) &&
     (((cpi->common).current_frame.frame_type & 0xfd) != 0)) {
    if (part_state->partition_rect_allowed[0] == 0) {
      if ((bVar23 < 3) || (part_state->partition_rect_allowed[1] == 0)) goto LAB_0031d4da;
    }
    else if (bVar23 < 3) goto LAB_0031d4da;
    if ((cpi->common).width == (cpi->common).superres_upscaled_width) {
      write_features_to_file
                ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
                 dnn_features,0x19,1,BVar18,(int)uVar25,(int)fVar24);
      bVar23 = (byte)uVar25;
      _Var3 = ext_ml_model_decision_before_none_part2
                        (cpi,dnn_features,part_state->prune_rect_part,
                         part_state->prune_rect_part + 1);
      if (_Var3) {
        return;
      }
    }
  }
LAB_0031d4da:
  lVar8 = 0;
  do {
    dnn_features[lVar8] =
         (dnn_features[lVar8] -
         *(float *)((long)&av1_simple_motion_search_prune_rect_mean_rel + (long)iVar5 + lVar8 * 4))
         / *(float *)((long)&av1_simple_motion_search_prune_rect_std_rel + (long)iVar7 + lVar8 * 4);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x19);
  output.output_strides = (int *)0x0;
  output.output_buffer = (float **)0x0;
  output.num_outputs = 0;
  output._4_4_ = 0;
  output.output_channels = (int *)0x0;
  thread_data.num_workers = 0;
  thread_data._4_4_ = 0;
  thread_data.workers = (AVxWorker *)0x0;
  iVar5 = 10;
  if (bVar23 == 3) {
    iVar5 = 4;
  }
  if (bVar23 == 0xf) {
    iVar5 = 4;
  }
  (*av1_nn_predict)(dnn_features,
                    (NN_CONFIG *)
                    ((long)&av1_simple_motion_search_prune_rect_nn_config_rel + (long)iVar1),1,
                    (float *)&output);
  av1_nn_softmax((float *)&output,(float *)&thread_data,iVar5);
  if ((float)thread_data._4_4_ <= fVar24) {
    part_state->prune_rect_part[0] = 1;
  }
  if (thread_data.workers._0_4_ <= fVar24) {
    part_state->prune_rect_part[1] = 1;
  }
  return;
}

Assistant:

void av1_prune_partitions_before_search(AV1_COMP *const cpi,
                                        MACROBLOCK *const x,
                                        SIMPLE_MOTION_DATA_TREE *const sms_tree,
                                        PartitionSearchState *part_state) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const BLOCK_SIZE bsize = blk_params->bsize;

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx) {
    int mi_row = blk_params->mi_row;
    int mi_col = blk_params->mi_col;
    double ratio_h, ratio_w;
    av1_get_third_pass_ratio(cpi->third_pass_ctx, 0, cm->height, cm->width,
                             &ratio_h, &ratio_w);
    THIRD_PASS_MI_INFO *this_mi = av1_get_third_pass_mi(
        cpi->third_pass_ctx, 0, mi_row, mi_col, ratio_h, ratio_w);
    BLOCK_SIZE third_pass_bsize =
        av1_get_third_pass_adjusted_blk_size(this_mi, ratio_h, ratio_w);
    // check the actual partition of this block in the second pass
    PARTITION_TYPE third_pass_part =
        av1_third_pass_get_sb_part_type(cpi->third_pass_ctx, this_mi);

    int is_edge = (mi_row + mi_size_high[bsize] >= cm->mi_params.mi_rows) ||
                  (mi_col + mi_size_wide[bsize] >= cm->mi_params.mi_cols);

    if (!is_edge && block_size_wide[bsize] >= 16) {
      // If in second pass we used rectangular partition, then do not search for
      // rectangular partition in the different direction.
      if (third_pass_part != PARTITION_NONE) {
        if (third_pass_part == PARTITION_HORZ ||
            third_pass_part == PARTITION_HORZ_4 ||
            third_pass_part == PARTITION_HORZ_A ||
            third_pass_part == PARTITION_HORZ_B) {
          part_state->partition_rect_allowed[VERT] = 0;
        } else if (third_pass_part == PARTITION_VERT ||
                   third_pass_part == PARTITION_VERT_4 ||
                   third_pass_part == PARTITION_VERT_A ||
                   third_pass_part == PARTITION_VERT_B) {
          part_state->partition_rect_allowed[HORZ] = 0;
        }
      }

      int minSize = AOMMIN(block_size_wide[third_pass_bsize],
                           block_size_high[third_pass_bsize]);
      int maxSize = AOMMAX(block_size_wide[third_pass_bsize],
                           block_size_high[third_pass_bsize]);
      if (block_size_wide[bsize] < minSize / 4) {
        // Current partition is too small, just terminate
        part_state->terminate_partition_search = 1;
        return;
      } else if (block_size_wide[bsize] < minSize / 2) {
        if (third_pass_part != PARTITION_NONE) {
          // Current partition is very small, and in second pass we used
          // rectangular partition. Terminate the search here then.
          part_state->terminate_partition_search = 1;
          return;
        } else {
          // Partition is small, but we still check this partition, only disable
          // further splits.
          // TODO(any): check why this is not covered by the termination for <
          // minSize/4.
          av1_disable_square_split_partition(part_state);
          av1_disable_rect_partitions(part_state);
          return;
        }
      } else if (block_size_wide[bsize] > maxSize) {
        // Partition is larger than in the second pass. Only allow split.
        av1_set_square_split_only(part_state);
        return;
      } else if (block_size_wide[bsize] >= minSize &&
                 block_size_wide[bsize] <= maxSize) {
        // Partition is within a range where it is very likely to find a good
        // choice, so do not prune anything.
        return;
      }
    }
  }
#endif  // CONFIG_THREE_PASS

  // Prune rectangular partitions for larger blocks.
  if (bsize > cpi->sf.part_sf.rect_partition_eval_thresh) {
    part_state->do_rectangular_split = 0;
    part_state->partition_rect_allowed[HORZ] = 0;
    part_state->partition_rect_allowed[VERT] = 0;
  }

  // Prune rectangular, AB and 4-way partition based on q index and block size
  if (cpi->sf.part_sf.prune_rectangular_split_based_on_qidx == 1) {
    if (bsize == BLOCK_8X8 && x->qindex < 35)
      av1_disable_rect_partitions(part_state);

  } else if (cpi->sf.part_sf.prune_rectangular_split_based_on_qidx == 2) {
    // Enumeration difference between two square partitions
    const int sqr_bsize_step = BLOCK_32X32 - BLOCK_16X16;
    int max_bsize =
        BLOCK_32X32 - (x->qindex * 3 / QINDEX_RANGE) * sqr_bsize_step;
    max_bsize = AOMMAX(max_bsize, BLOCK_4X4);
    const BLOCK_SIZE max_prune_bsize =
        (BLOCK_SIZE)AOMMIN(max_bsize, BLOCK_32X32);

    // Prune partition
    // qidx 0 to 85: prune bsize below BLOCK_32X32
    // qidx 86 to 170: prune bsize below BLOCK_16X16
    // qidx 171 to 255: prune bsize below BLOCK_8X8
    if (bsize < max_prune_bsize) {
      av1_disable_rect_partitions(part_state);
    }
  }

  if (cpi->sf.part_sf.prune_sub_8x8_partition_level && (bsize == BLOCK_8X8)) {
    const MACROBLOCKD *const xd = &x->e_mbd;
    int prune_sub_8x8;
    if (cpi->sf.part_sf.prune_sub_8x8_partition_level == 2) {
      prune_sub_8x8 = 1;
    } else {
      assert(cpi->sf.part_sf.prune_sub_8x8_partition_level == 1);
      // Prune if both neighbors are available and either is > BLOCK_8X8
      prune_sub_8x8 = xd->left_available && xd->up_available &&
                      (xd->left_mbmi->bsize > BLOCK_8X8 ||
                       xd->above_mbmi->bsize > BLOCK_8X8);
    }
    if (prune_sub_8x8) {
      av1_disable_all_splits(part_state);
    }
  }

  // A CNN-based speed feature pruning out either split or all non-split
  // partition in INTRA frame coding.
  const int try_intra_cnn_based_part_prune =
      frame_is_intra_only(cm) &&
      cpi->sf.part_sf.intra_cnn_based_part_prune_level &&
      cm->seq_params->sb_size >= BLOCK_64X64 && bsize <= BLOCK_64X64 &&
      blk_params->bsize_at_least_8x8 &&
      av1_is_whole_blk_in_frame(blk_params, mi_params);

  if (try_intra_cnn_based_part_prune) {
    intra_mode_cnn_partition(&cpi->common, x, x->part_search_info.quad_tree_idx,
                             cpi->sf.part_sf.intra_cnn_based_part_prune_level,
                             part_state);
  }

  // Use simple motion search to prune out split or non-split partitions. This
  // must be done prior to PARTITION_SPLIT to propagate the initial mvs to a
  // smaller blocksize.
  const int try_split_only =
      cpi->sf.part_sf.simple_motion_search_split &&
      part_state->do_square_split && blk_params->bsize_at_least_8x8 &&
      av1_is_whole_blk_in_frame(blk_params, mi_params) &&
      !frame_is_intra_only(cm) && !av1_superres_scaled(cm);

  if (try_split_only) {
    simple_motion_search_based_split(cpi, x, sms_tree, part_state);
  }

  // Use simple motion search to prune out rectangular partition in some
  // direction. The results are stored in prune_horz and prune_vert in order to
  // bypass future related pruning checks if a pruning decision has been made.

  // We want to search at least one partition mode, so don't prune if NONE and
  // SPLIT are disabled.
  const int non_rect_part_allowed =
      part_state->do_square_split || part_state->partition_none_allowed;
  // Only run the model if the partitions are not already pruned.
  const int rect_part_allowed = part_state->do_rectangular_split &&
                                ((part_state->partition_rect_allowed[HORZ] &&
                                  !part_state->prune_rect_part[HORZ]) ||
                                 (part_state->partition_rect_allowed[VERT] &&
                                  !part_state->prune_rect_part[VERT]));

  const int try_prune_rect = cpi->sf.part_sf.simple_motion_search_prune_rect &&
                             !frame_is_intra_only(cm) &&
                             non_rect_part_allowed && rect_part_allowed &&
                             !av1_superres_scaled(cm);

  if (try_prune_rect) {
    simple_motion_search_prune_rect(cpi, x, sms_tree, part_state);
  }
}